

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_leaf_node.h
# Opt level: O2

void __thiscall compose::BlackLeafNode::PrintName(BlackLeafNode *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"black leaf node :");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_LeafNode).super_INode.name_);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void BlackLeafNode::PrintName() {
    std::cout << "black leaf node :" << name_ << std::endl;
}